

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpulseGenerator.cpp
# Opt level: O2

int ImpulseGenerator::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x200);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Base Period","ms",0.0,5000.0,200.0,1.0,3.0,0,
                    "Base time between impulses");
  RegisterParameter(definition,"Random Period","ms",0.0,5000.0,100.0,1.0,3.0,1,
                    "Random time between impulses");
  RegisterParameter(definition,"Base Amp","",0.0,1.0,0.5,1.0,1.0,2,"Base amplitude of impulses");
  RegisterParameter(definition,"Random Amp","",0.0,1.0,0.5,1.0,3.0,3,"Random amplitude of impulses")
  ;
  RegisterParameter(definition,"Base Decay","ms",0.0,10000.0,10.0,1.0,3.0,4,"Decay time of impulses"
                   );
  RegisterParameter(definition,"Random Decay","ms",0.0,10000.0,0.0,1.0,3.0,5,
                    "Decay time of impulses");
  RegisterParameter(definition,"Noise Level","",0.0,50.0,0.0,1.0,3.0,6,
                    "Level of additive white noise");
  RegisterParameter(definition,"Noise Mix","",0.0,1.0,0.0,1.0,3.0,7,
                    "Level of white noise multiplied by impulse");
  return 8;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Base Period", "ms", 0.0f, 5000.0f, 200.0f, 1.0f, 3.0f, P_BASEPERIOD, "Base time between impulses");
        RegisterParameter(definition, "Random Period", "ms", 0.0f, 5000.0f, 100.0f, 1.0f, 3.0f, P_RANDOMPERIOD, "Random time between impulses");
        RegisterParameter(definition, "Base Amp", "", 0.0f, 1.0f, 0.5f, 1.0f, 1.0f, P_BASEAMP, "Base amplitude of impulses");
        RegisterParameter(definition, "Random Amp", "", 0.0f, 1.0f, 0.5f, 1.0f, 3.0f, P_RANDOMAMP, "Random amplitude of impulses");
        RegisterParameter(definition, "Base Decay", "ms", 0.0f, 10000.0f, 10.0f, 1.0f, 3.0f, P_BASEDECAY, "Decay time of impulses");
        RegisterParameter(definition, "Random Decay", "ms", 0.0f, 10000.0f, 0.0f, 1.0f, 3.0f, P_RANDOMDECAY, "Decay time of impulses");
        RegisterParameter(definition, "Noise Level", "", 0.0f, 50.0f, 0.0f, 1.0f, 3.0f, P_NOISEADD, "Level of additive white noise");
        RegisterParameter(definition, "Noise Mix", "", 0.0f, 1.0f, 0.0f, 1.0f, 3.0f, P_NOISEMIX, "Level of white noise multiplied by impulse");
        return numparams;
    }